

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_histogram<long,_(unsigned_char)'\x02'>::~basic_dynamic_histogram
          (basic_dynamic_histogram<long,_(unsigned_char)__x02_> *this)

{
  (this->super_dynamic_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_dynamic_histogram_001e92c8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sum_).
              super___shared_ptr<ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>_>_>
  ::~vector(&this->bucket_counts_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>);
  metric_t::~metric_t((metric_t *)this);
  return;
}

Assistant:

basic_dynamic_histogram(std::string name, std::string help,
                          std::vector<double> buckets,
                          std::array<std::string, N> labels_name)
      : bucket_boundaries_(buckets),
        dynamic_metric(MetricType::Histogram, name, help, labels_name),
        sum_(std::make_shared<basic_dynamic_gauge<value_type, N>>(
            name, help, labels_name)) {
    for (size_t i = 0; i < buckets.size() + 1; i++) {
      bucket_counts_.push_back(
          std::make_shared<basic_dynamic_counter<value_type, N>>(name, help,
                                                                 labels_name));
    }
  }